

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O2

void GetDifferenceInternal
               (S2CellId cell,S2CellUnion *y,vector<S2CellId,_std::allocator<S2CellId>_> *cell_ids)

{
  bool bVar1;
  S2CellId cell_00;
  int iVar2;
  S2CellId cell_local;
  
  cell_local = cell;
  bVar1 = S2CellUnion::Intersects(y,cell);
  if (bVar1) {
    bVar1 = S2CellUnion::Contains(y,cell);
    if (!bVar1) {
      cell_00 = S2CellId::child_begin(&cell_local);
      iVar2 = 3;
      while( true ) {
        GetDifferenceInternal(cell_00,y,cell_ids);
        bVar1 = iVar2 == 0;
        iVar2 = iVar2 + -1;
        if (bVar1) break;
        cell_00.id_ = cell_00.id_ + (-cell_00.id_ & cell_00.id_) * 2;
      }
    }
  }
  else {
    std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back(cell_ids,&cell_local);
  }
  return;
}

Assistant:

static void GetDifferenceInternal(S2CellId cell,
                                  const S2CellUnion& y,
                                  vector<S2CellId>* cell_ids) {
  // Add the difference between cell and y to cell_ids.
  // If they intersect but the difference is non-empty, divide and conquer.
  if (!y.Intersects(cell)) {
    cell_ids->push_back(cell);
  } else if (!y.Contains(cell)) {
    S2CellId child = cell.child_begin();
    for (int i = 0; ; ++i) {
      GetDifferenceInternal(child, y, cell_ids);
      if (i == 3) break;  // Avoid unnecessary next() computation.
      child = child.next();
    }
  }
}